

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O0

MPP_RET os_allocator_drm_free(void *ctx,MppBufferInfo *data)

{
  allocator_ctx_drm *p;
  MppBufferInfo *data_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_drm","does not accept NULL input\n","os_allocator_drm_free");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((drm_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_drm","dev %d handle %p unmap %p fd %d size %d\n","os_allocator_drm_free",
                 (ulong)*(uint *)((long)ctx + 4),data->hnd,data->ptr,data->fd,data->size);
    }
    if (data->ptr != (void *)0x0) {
      munmap(data->ptr,data->size);
      data->ptr = (void *)0x0;
    }
    if (data->fd < 1) {
      _mpp_log_l(2,"mpp_drm","can not close invalid fd %d\n","os_allocator_drm_free",
                 (ulong)(uint)data->fd);
    }
    else {
      close(data->fd);
      data->fd = -1;
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET os_allocator_drm_free(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_drm *p = NULL;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (allocator_ctx_drm *)ctx;

    drm_dbg_func("dev %d handle %p unmap %p fd %d size %d\n", p->drm_device,
                 data->hnd, data->ptr, data->fd, data->size);

    if (data->ptr) {
        munmap(data->ptr, data->size);
        data->ptr = NULL;
    }

    if (data->fd > 0) {
        close(data->fd);
        data->fd = -1;
    } else {
        mpp_err_f("can not close invalid fd %d\n", data->fd);
    }

    return MPP_OK;
}